

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util_test.cc
# Opt level: O2

void __thiscall
RegisterStringPieceUtilTestJoinStringPiece::RegisterStringPieceUtilTestJoinStringPiece
          (RegisterStringPieceUtilTestJoinStringPiece *this)

{
  RegisterTest(StringPieceUtilTestJoinStringPiece::Create,"StringPieceUtilTest.JoinStringPiece");
  return;
}

Assistant:

TEST(StringPieceUtilTest, JoinStringPiece) {
  {
    string input("a:b:c");
    vector<StringPiece> list = SplitStringPiece(input, ':');

    EXPECT_EQ("a:b:c", JoinStringPiece(list, ':'));
    EXPECT_EQ("a/b/c", JoinStringPiece(list, '/'));
  }

  {
    string empty("");
    vector<StringPiece> list = SplitStringPiece(empty, ':');

    EXPECT_EQ("", JoinStringPiece(list, ':'));
  }

  {
    vector<StringPiece> empty_list;

    EXPECT_EQ("", JoinStringPiece(empty_list, ':'));
  }

  {
    string one("a");
    vector<StringPiece> single_list = SplitStringPiece(one, ':');

    EXPECT_EQ("a", JoinStringPiece(single_list, ':'));
  }

  {
    string sep(":a:b:c:");
    vector<StringPiece> list = SplitStringPiece(sep, ':');

    EXPECT_EQ(":a:b:c:", JoinStringPiece(list, ':'));
  }
}